

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O2

string * __thiscall
spvtools::FriendlyNameMapper::NameForEnumOperand_abi_cxx11_
          (string *__return_storage_ptr__,FriendlyNameMapper *this,spv_operand_type_t type,
          uint32_t word)

{
  spv_result_t sVar1;
  uint32_t n;
  spv_operand_desc desc;
  allocator<char> local_69;
  spv_operand_desc local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_68 = (spv_operand_desc)0x0;
  sVar1 = AssemblyGrammar::lookupOperand(&this->grammar_,type,word,&local_68);
  if (sVar1 == SPV_SUCCESS) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_68->name,(allocator<char> *)&local_60);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"StorageClass",&local_69)
    ;
    to_string_abi_cxx11_(&local_40,(spvtools *)(ulong)word,n);
    std::operator+(__return_storage_ptr__,&local_60,&local_40);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FriendlyNameMapper::NameForEnumOperand(spv_operand_type_t type,
                                                   uint32_t word) {
  spv_operand_desc desc = nullptr;
  if (SPV_SUCCESS == grammar_.lookupOperand(type, word, &desc)) {
    return desc->name;
  } else {
    // Invalid input.  Just give something.
    return std::string("StorageClass") + to_string(word);
  }
}